

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int archive_read_format_7zip_bid(archive_read *a,int best_bid)

{
  uint uVar1;
  long in_RAX;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  ssize_t window;
  ulong uVar5;
  size_t min;
  long lVar6;
  char *p;
  ssize_t bytes_avail;
  long local_38;
  
  iVar4 = -1;
  if (best_bid < 0x21) {
    local_38 = in_RAX;
    piVar2 = (int *)__archive_read_ahead(a,6,(ssize_t *)0x0);
    iVar4 = 0;
    if (piVar2 != (int *)0x0) {
      if ((short)piVar2[1] == 0x1c27 && *piVar2 == -0x504385c9) {
LAB_003ef598:
        iVar4 = 0x30;
      }
      else {
        iVar4 = 0;
        if ((((char)*piVar2 == 'M') && (*(char *)((long)piVar2 + 1) == 'Z')) ||
           (*piVar2 == 0x464c457f)) {
          lVar6 = 0x27000;
          uVar5 = 0x1000;
          min = 0x28000;
          do {
            pvVar3 = __archive_read_ahead(a,min,&local_38);
            if (pvVar3 == (void *)0x0) {
              uVar5 = (long)uVar5 >> 1;
              if (uVar5 < 0x40) {
                return 0;
              }
            }
            else {
              p = (char *)(lVar6 + (long)pvVar3);
              while (p + 0x20 < (char *)(local_38 + (long)pvVar3)) {
                uVar1 = check_7zip_header_in_sfx(p);
                p = p + uVar1;
                if (uVar1 == 0) goto LAB_003ef598;
              }
              lVar6 = (long)p - (long)pvVar3;
            }
            min = lVar6 + uVar5;
          } while ((long)min < 0x60001);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int
archive_read_format_7zip_bid(struct archive_read *a, int best_bid)
{
	const char *p;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	if ((p = __archive_read_ahead(a, 6, NULL)) == NULL)
		return (0);

	/* If first six bytes are the 7-Zip signature,
	 * return the bid right now. */
	if (memcmp(p, _7ZIP_SIGNATURE, 6) == 0)
		return (48);

	/*
	 * It may a 7-Zip SFX archive file. If first two bytes are
	 * 'M' and 'Z' available on Windows or first four bytes are
	 * "\x7F\x45LF" available on posix like system, seek the 7-Zip
	 * signature. Although we will perform a seek when reading
	 * a header, what we do not use __archive_read_seek() here is
	 * due to a bidding performance.
	 */
	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		ssize_t offset = SFX_MIN_ADDR;
		ssize_t window = 4096;
		ssize_t bytes_avail;
		while (offset + window <= (SFX_MAX_ADDR)) {
			const char *buff = __archive_read_ahead(a,
					offset + window, &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 0x40)
					return (0);
				continue;
			}
			p = buff + offset;
			while (p + 32 < buff + bytes_avail) {
				int step = check_7zip_header_in_sfx(p);
				if (step == 0)
					return (48);
				p += step;
			}
			offset = p - buff;
		}
	}
	return (0);
}